

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcDistributionFlowElementType::~IfcDistributionFlowElementType
          (IfcDistributionFlowElementType *this)

{
  ~IfcDistributionFlowElementType(this);
  operator_delete(this,0x1b8);
  return;
}

Assistant:

IfcDistributionFlowElementType() : Object("IfcDistributionFlowElementType") {}